

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O1

uchar __thiscall MedianFilterCV_8U::getMedian(MedianFilterCV_8U *this,Mat *param_1,int y,int x)

{
  byte bVar1;
  Mat *pMVar2;
  long lVar3;
  int iVar4;
  uchar *puVar5;
  int f;
  int iVar6;
  long lVar7;
  uchar __tmp;
  uchar mergeResult [6];
  
  pMVar2 = this->sourceImage;
  lVar7 = (long)(y + -1);
  lVar3 = (long)x;
  this->firstTempArray[0] =
       *(uchar *)(lVar3 + -1 + **(long **)(pMVar2 + 0x48) * lVar7 + *(long *)(pMVar2 + 0x10));
  this->firstTempArray[1] =
       *(uchar *)(lVar3 + **(long **)(pMVar2 + 0x48) * lVar7 + *(long *)(pMVar2 + 0x10));
  this->firstTempArray[2] =
       *(uchar *)(lVar3 + 1 + lVar7 * **(long **)(pMVar2 + 0x48) + *(long *)(pMVar2 + 0x10));
  lVar7 = (long)y;
  this->secondTempArray[0] =
       *(uchar *)(lVar3 + -1 + **(long **)(pMVar2 + 0x48) * lVar7 + *(long *)(pMVar2 + 0x10));
  this->secondTempArray[1] =
       *(uchar *)(lVar3 + **(long **)(pMVar2 + 0x48) * lVar7 + *(long *)(pMVar2 + 0x10));
  this->secondTempArray[2] =
       *(uchar *)(lVar3 + 1 + **(long **)(pMVar2 + 0x48) * lVar7 + *(long *)(pMVar2 + 0x10));
  lVar7 = (long)(y + 1);
  this->thirdTempArray[0] =
       *(uchar *)(lVar3 + -1 + **(long **)(pMVar2 + 0x48) * lVar7 + *(long *)(pMVar2 + 0x10));
  this->thirdTempArray[1] =
       *(uchar *)(lVar3 + **(long **)(pMVar2 + 0x48) * lVar7 + *(long *)(pMVar2 + 0x10));
  this->thirdTempArray[2] =
       *(uchar *)(lVar3 + 1 + lVar7 * **(long **)(pMVar2 + 0x48) + *(long *)(pMVar2 + 0x10));
  lVar7 = 0;
  do {
    iVar4 = *(int *)((long)&this->pairsForSortThreeElements[0].first + lVar7);
    iVar6 = *(int *)((long)&this->pairsForSortThreeElements[0].second + lVar7);
    bVar1 = this->firstTempArray[iVar4];
    if (this->firstTempArray[iVar6] < bVar1) {
      this->firstTempArray[iVar4] = this->firstTempArray[iVar6];
      this->firstTempArray[iVar6] = bVar1;
    }
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x18);
  lVar7 = 0;
  do {
    iVar4 = *(int *)((long)&this->pairsForSortThreeElements[0].first + lVar7);
    iVar6 = *(int *)((long)&this->pairsForSortThreeElements[0].second + lVar7);
    bVar1 = this->secondTempArray[iVar4];
    if (this->secondTempArray[iVar6] < bVar1) {
      this->secondTempArray[iVar4] = this->secondTempArray[iVar6];
      this->secondTempArray[iVar6] = bVar1;
    }
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x18);
  lVar7 = 0;
  do {
    iVar4 = *(int *)((long)&this->pairsForSortThreeElements[0].first + lVar7);
    iVar6 = *(int *)((long)&this->pairsForSortThreeElements[0].second + lVar7);
    bVar1 = this->thirdTempArray[iVar4];
    if (this->thirdTempArray[iVar6] < bVar1) {
      this->thirdTempArray[iVar4] = this->thirdTempArray[iVar6];
      this->thirdTempArray[iVar6] = bVar1;
    }
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x18);
  lVar7 = 0;
  iVar4 = 0;
  iVar6 = 0;
  do {
    if ((iVar4 == 3) ||
       ((iVar6 != 3 && (this->firstTempArray[iVar6] < this->secondTempArray[iVar4])))) {
      lVar3 = (long)iVar6;
      iVar6 = iVar6 + 1;
      puVar5 = this->firstTempArray + lVar3;
    }
    else {
      puVar5 = this->secondTempArray + iVar4;
      iVar4 = iVar4 + 1;
    }
    mergeResult[lVar7] = *puVar5;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
  iVar4 = 0;
  lVar7 = 5;
  iVar6 = 0;
  do {
    if ((iVar4 == 3) || ((iVar6 != 6 && (mergeResult[iVar6] < this->thirdTempArray[iVar4])))) {
      lVar3 = (long)iVar6;
      iVar6 = iVar6 + 1;
      puVar5 = mergeResult + lVar3;
    }
    else {
      puVar5 = this->thirdTempArray + iVar4;
      iVar4 = iVar4 + 1;
    }
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  return *puVar5;
}

Assistant:

uchar MedianFilterCV_8U::getMedian(const cv::Mat &, int y, int x) {
    initThreeAdjacentPixels(*sourceImage, firstTempArray, y - 1, x, true);
    initThreeAdjacentPixels(*sourceImage, secondTempArray, y, x, true);
    initThreeAdjacentPixels(*sourceImage, thirdTempArray, y + 1, x, true);

    sortThreeElements(firstTempArray);
    sortThreeElements(secondTempArray);
    sortThreeElements(thirdTempArray);

    uchar mergeResult[6];
    mergeTwoSortedArray(firstTempArray, 3, secondTempArray, 3, mergeResult);

    return getMedianOfTwoSortedArray(mergeResult, 6, thirdTempArray, 3);
}